

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenFile.cpp
# Opt level: O1

bool CascOpenFile(HANDLE hStorage,char *szFileName,DWORD dwLocaleFlags,DWORD dwOpenFlags,
                 HANDLE *phFile)

{
  bool bVar1;
  DWORD DVar2;
  int iVar3;
  TCascStorage *hs;
  undefined4 extraout_var;
  LPBYTE pBVar4;
  DWORD dwContentSize;
  QUERY_KEY QueryKey;
  BYTE KeyBuffer [16];
  DWORD local_4c;
  _QUERY_KEY local_48;
  BYTE local_38 [16];
  
  local_4c = 0xffffffff;
  hs = IsValidCascStorageHandle(hStorage);
  if (hs == (TCascStorage *)0x0) {
    DVar2 = 9;
  }
  else {
    DVar2 = 0x16;
    if (szFileName != (char *)0x0) {
      bVar1 = false;
      if ((phFile == (HANDLE *)0x0) || (bVar1 = false, *szFileName == '\0')) goto LAB_00113373;
      if ((dwOpenFlags & 0xf) - 1 < 2) {
        DVar2 = ConvertStringToBinary(szFileName,0x20,local_38);
        pBVar4 = (LPBYTE)0x0;
        if (DVar2 == 0) {
          pBVar4 = local_38;
        }
      }
      else {
        if ((dwOpenFlags & 0xf) == 0) {
          iVar3 = (*hs->pRootHandler->_vptr_TRootHandler[5])(hs->pRootHandler,szFileName,&local_4c);
          DVar2 = 0;
          if ((LPBYTE)CONCAT44(extraout_var,iVar3) != (LPBYTE)0x0) {
            dwOpenFlags = dwOpenFlags | 2 - ((hs->pRootHandler->dwRootFlags & 2) == 0);
            pBVar4 = (LPBYTE)CONCAT44(extraout_var,iVar3);
            goto LAB_001133d2;
          }
          DVar2 = 2;
        }
        else {
          DVar2 = 0x16;
        }
        pBVar4 = (LPBYTE)0x0;
      }
LAB_001133d2:
      if (DVar2 == 0) {
        local_48.cbData = 0x10;
        local_48.pbData = pBVar4;
        if ((dwOpenFlags & 0xf) == 2) {
          bVar1 = OpenFileByEKey(hs,(PQUERY_KEY)0x0,&local_48,dwOpenFlags,local_4c,
                                 (TCascFile **)phFile);
LAB_00113420:
          DVar2 = 0;
          if (bVar1 != false) goto LAB_00113442;
        }
        else {
          if ((dwOpenFlags & 0xf) == 1) {
            bVar1 = OpenFileByCKey(hs,&local_48,dwOpenFlags,(TCascFile **)phFile);
            goto LAB_00113420;
          }
          SetLastError(0x16);
        }
        DVar2 = GetLastError();
        if (DVar2 == 0) {
          __assert_fail("GetLastError() != ERROR_SUCCESS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascOpenFile.cpp"
                        ,0x112,"bool CascOpenFile(HANDLE, const char *, DWORD, DWORD, HANDLE *)");
        }
        DVar2 = GetLastError();
      }
LAB_00113442:
      bVar1 = DVar2 == 0;
      if (bVar1) {
        return bVar1;
      }
      goto LAB_00113373;
    }
  }
  bVar1 = false;
LAB_00113373:
  SetLastError(DVar2);
  return bVar1;
}

Assistant:

bool WINAPI CascOpenFile(HANDLE hStorage, const char * szFileName, DWORD dwLocaleFlags, DWORD dwOpenFlags, HANDLE * phFile)
{
    TCascStorage * hs;
    QUERY_KEY QueryKey;
    LPBYTE pbQueryKey = NULL;
    BYTE KeyBuffer[MD5_HASH_SIZE];
    DWORD dwContentSize = CASC_INVALID_SIZE;
    bool bOpenResult = false;
    int nError = ERROR_SUCCESS;

    // This parameter is not used
    CASCLIB_UNUSED(dwLocaleFlags);

    // Validate the storage handle
    hs = IsValidCascStorageHandle(hStorage);
    if(hs == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return false;
    }

    // Validate the other parameters
    if(szFileName == NULL || szFileName[0] == 0 || phFile == NULL)
    {
        SetLastError(ERROR_INVALID_PARAMETER);
        return false;
    }

    // Retrieve the CKey/EKey from the file name in different modes
    switch(dwOpenFlags & CASC_OPEN_TYPE_MASK)
    {
        case CASC_OPEN_BY_NAME:
            
            // Retrieve the file CKey/EKey
            pbQueryKey = hs->pRootHandler->GetKey(szFileName, &dwContentSize);
            if(pbQueryKey == NULL)
            {
                nError = ERROR_FILE_NOT_FOUND;
                break;
            }

            // Change the proper open flags
            dwOpenFlags |= (hs->pRootHandler->GetFlags() & ROOT_FLAG_USES_EKEY) ? CASC_OPEN_BY_EKEY : CASC_OPEN_BY_CKEY;
            break;

        case CASC_OPEN_BY_CKEY:
        case CASC_OPEN_BY_EKEY:

            // Convert the string to binary
            nError = ConvertStringToBinary(szFileName, MD5_STRING_SIZE, KeyBuffer);
            if(nError != ERROR_SUCCESS)
                break;
            
            // Proceed opening by CKey
            pbQueryKey = KeyBuffer;
            break;

        default:

            // Unknown open mode
            nError = ERROR_INVALID_PARAMETER;
            break;
    }

    // Perform the open operation
    if(nError == ERROR_SUCCESS)
    {
        // Setup the CKey/EKey
        QueryKey.pbData = pbQueryKey;
        QueryKey.cbData = MD5_HASH_SIZE;

        // Either open by CKey or EKey
        switch(dwOpenFlags & CASC_OPEN_TYPE_MASK)
        {
            case CASC_OPEN_BY_CKEY:
                bOpenResult = OpenFileByCKey(hs, &QueryKey, dwOpenFlags, (TCascFile **)phFile);
                break;

            case CASC_OPEN_BY_EKEY:
                bOpenResult = OpenFileByEKey(hs, NULL, &QueryKey, dwOpenFlags, dwContentSize, (TCascFile **)phFile);
                break;

            default:
                SetLastError(ERROR_INVALID_PARAMETER);
                break;
        }

        // Handle the error code
        if(!bOpenResult)
        {
            assert(GetLastError() != ERROR_SUCCESS);
            nError = GetLastError();
        }
    }

    // Set the last error and return
    if(nError != ERROR_SUCCESS)
        SetLastError(nError);
    return (nError == ERROR_SUCCESS);
}